

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCTestBuildAndTestHandler.cxx
# Opt level: O0

void __thiscall
cmCTestBuildAndTestCaptureRAII::cmCTestBuildAndTestCaptureRAII
          (cmCTestBuildAndTestCaptureRAII *this,cmake *cm,string *s)

{
  cmake *this_00;
  anon_class_8_1_54a39813 local_d0;
  ProgressCallbackType local_c8;
  anon_class_8_1_54a39813 local_a8;
  OutputCallback local_a0;
  anon_class_8_1_54a39813 local_80;
  OutputCallback local_78;
  anon_class_8_1_54a39813 local_48;
  MessageCallback local_40;
  string *local_20;
  string *s_local;
  cmake *cm_local;
  cmCTestBuildAndTestCaptureRAII *this_local;
  
  this->CM = cm;
  local_48.s = s;
  local_20 = s;
  s_local = (string *)cm;
  cm_local = (cmake *)this;
  std::function<void(std::__cxx11::string_const&,cmMessageMetadata_const&)>::
  function<cmCTestBuildAndTestCaptureRAII::cmCTestBuildAndTestCaptureRAII(cmake&,std::__cxx11::string&)::_lambda(std::__cxx11::string_const&,cmMessageMetadata_const&)_1_,void>
            ((function<void(std::__cxx11::string_const&,cmMessageMetadata_const&)> *)&local_40,
             &local_48);
  cmSystemTools::SetMessageCallback(&local_40);
  std::
  function<void_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_const_cmMessageMetadata_&)>
  ::~function(&local_40);
  local_80.s = local_20;
  std::function<void(std::__cxx11::string_const&)>::
  function<cmCTestBuildAndTestCaptureRAII::cmCTestBuildAndTestCaptureRAII(cmake&,std::__cxx11::string&)::_lambda(std::__cxx11::string_const&)_1_,void>
            ((function<void(std::__cxx11::string_const&)> *)&local_78,&local_80);
  cmSystemTools::SetStdoutCallback(&local_78);
  std::
  function<void_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
  ::~function(&local_78);
  local_a8.s = local_20;
  std::function<void(std::__cxx11::string_const&)>::
  function<cmCTestBuildAndTestCaptureRAII::cmCTestBuildAndTestCaptureRAII(cmake&,std::__cxx11::string&)::_lambda(std::__cxx11::string_const&)_2_,void>
            ((function<void(std::__cxx11::string_const&)> *)&local_a0,&local_a8);
  cmSystemTools::SetStderrCallback(&local_a0);
  std::
  function<void_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
  ::~function(&local_a0);
  this_00 = this->CM;
  local_d0.s = local_20;
  std::function<void(std::__cxx11::string_const&,float)>::
  function<cmCTestBuildAndTestCaptureRAII::cmCTestBuildAndTestCaptureRAII(cmake&,std::__cxx11::string&)::_lambda(std::__cxx11::string_const&,float)_1_,void>
            ((function<void(std::__cxx11::string_const&,float)> *)&local_c8,&local_d0);
  cmake::SetProgressCallback(this_00,&local_c8);
  std::
  function<void_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_float)>
  ::~function(&local_c8);
  return;
}

Assistant:

cmCTestBuildAndTestCaptureRAII(cmake& cm, std::string& s)
    : CM(cm)
  {
    cmSystemTools::SetMessageCallback(
      [&s](const std::string& msg, const cmMessageMetadata& /* unused */) {
        s += msg;
        s += "\n";
      });

    cmSystemTools::SetStdoutCallback([&s](std::string const& m) { s += m; });
    cmSystemTools::SetStderrCallback([&s](std::string const& m) { s += m; });

    this->CM.SetProgressCallback([&s](const std::string& msg, float prog) {
      if (prog < 0) {
        s += msg;
        s += "\n";
      }
    });
  }